

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ResolveExprListNames(NameContext *pNC,ExprList *pList)

{
  Expr *pExpr;
  uint uVar1;
  int iVar2;
  ExprList_item *pEVar3;
  uint uVar4;
  Parse *pParse;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 local_68 [40];
  anon_union_8_18_67db040d_for_u local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (pList != (ExprList *)0x0) {
    pParse = pNC->pParse;
    local_68._8_8_ = resolveExprStep;
    local_68._16_8_ = resolveSelectStep;
    local_68._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
    uVar4 = pNC->ncFlags & 0x8009010;
    uVar1 = pNC->ncFlags & 0xf7ff6fef;
    pNC->ncFlags = uVar1;
    iVar2 = pList->nExpr;
    local_68._0_8_ = pParse;
    local_40.pNC = pNC;
    if (0 < iVar2) {
      local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pEVar3 = pList->a;
      lVar5 = 0;
      do {
        pExpr = pEVar3->pExpr;
        if (pExpr != (Expr *)0x0) {
          iVar2 = pParse->nHeight + pExpr->nHeight;
          pParse->nHeight = iVar2;
          if (pParse->db->aLimit[3] < iVar2) {
            sqlite3ErrorMsg(pParse,"Expression tree is too large (maximum depth %d)");
          }
          else {
            sqlite3WalkExprNN((Walker *)local_68,pExpr);
            *(int *)(local_68._0_8_ + 0x13c) = *(int *)(local_68._0_8_ + 0x13c) - pExpr->nHeight;
            uVar1 = pNC->ncFlags;
            if ((uVar1 & 0x8009010) != 0) {
              pExpr->flags = pExpr->flags | uVar1 & 0x8010;
              uVar4 = uVar4 | uVar1 & 0x8009010;
              uVar1 = uVar1 & 0xf7ff6fef;
              pNC->ncFlags = uVar1;
            }
            if (*(int *)(local_68._0_8_ + 0x34) < 1) {
              iVar2 = pList->nExpr;
              pParse = (Parse *)local_68._0_8_;
              goto LAB_001808c5;
            }
          }
          iVar2 = 1;
          goto LAB_001808f1;
        }
LAB_001808c5:
        lVar5 = lVar5 + 1;
        pEVar3 = pEVar3 + 1;
      } while (lVar5 < iVar2);
    }
    pNC->ncFlags = uVar1 | uVar4;
    iVar2 = 0;
  }
LAB_001808f1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprListNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  ExprList *pList         /* The expression list to be analyzed. */
){
  int i;
  int savedHasAgg = 0;
  Walker w;
  if( pList==0 ) return SQLITE_OK;
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr==0 ) continue;
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight += pExpr->nHeight;
    if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
      return SQLITE_ERROR;
    }
#endif
    sqlite3WalkExprNN(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight -= pExpr->nHeight;
#endif
    assert( EP_Agg==NC_HasAgg );
    assert( EP_Win==NC_HasWin );
    testcase( pNC->ncFlags & NC_HasAgg );
    testcase( pNC->ncFlags & NC_HasWin );
    if( pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg) ){
      ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
      savedHasAgg |= pNC->ncFlags &
                          (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
      pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
    }
    if( w.pParse->nErr>0 ) return SQLITE_ERROR;
  }
  pNC->ncFlags |= savedHasAgg;
  return SQLITE_OK;
}